

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_NV_evaluators(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_NV_evaluators != 0) {
    glad_glMapControlPointsNV = (PFNGLMAPCONTROLPOINTSNVPROC)(*load)("glMapControlPointsNV");
    glad_glMapParameterivNV = (PFNGLMAPPARAMETERIVNVPROC)(*load)("glMapParameterivNV");
    glad_glMapParameterfvNV = (PFNGLMAPPARAMETERFVNVPROC)(*load)("glMapParameterfvNV");
    glad_glGetMapControlPointsNV =
         (PFNGLGETMAPCONTROLPOINTSNVPROC)(*load)("glGetMapControlPointsNV");
    glad_glGetMapParameterivNV = (PFNGLGETMAPPARAMETERIVNVPROC)(*load)("glGetMapParameterivNV");
    glad_glGetMapParameterfvNV = (PFNGLGETMAPPARAMETERFVNVPROC)(*load)("glGetMapParameterfvNV");
    glad_glGetMapAttribParameterivNV =
         (PFNGLGETMAPATTRIBPARAMETERIVNVPROC)(*load)("glGetMapAttribParameterivNV");
    glad_glGetMapAttribParameterfvNV =
         (PFNGLGETMAPATTRIBPARAMETERFVNVPROC)(*load)("glGetMapAttribParameterfvNV");
    glad_glEvalMapsNV = (PFNGLEVALMAPSNVPROC)(*load)("glEvalMapsNV");
  }
  return;
}

Assistant:

static void load_GL_NV_evaluators(GLADloadproc load) {
	if(!GLAD_GL_NV_evaluators) return;
	glad_glMapControlPointsNV = (PFNGLMAPCONTROLPOINTSNVPROC)load("glMapControlPointsNV");
	glad_glMapParameterivNV = (PFNGLMAPPARAMETERIVNVPROC)load("glMapParameterivNV");
	glad_glMapParameterfvNV = (PFNGLMAPPARAMETERFVNVPROC)load("glMapParameterfvNV");
	glad_glGetMapControlPointsNV = (PFNGLGETMAPCONTROLPOINTSNVPROC)load("glGetMapControlPointsNV");
	glad_glGetMapParameterivNV = (PFNGLGETMAPPARAMETERIVNVPROC)load("glGetMapParameterivNV");
	glad_glGetMapParameterfvNV = (PFNGLGETMAPPARAMETERFVNVPROC)load("glGetMapParameterfvNV");
	glad_glGetMapAttribParameterivNV = (PFNGLGETMAPATTRIBPARAMETERIVNVPROC)load("glGetMapAttribParameterivNV");
	glad_glGetMapAttribParameterfvNV = (PFNGLGETMAPATTRIBPARAMETERFVNVPROC)load("glGetMapAttribParameterfvNV");
	glad_glEvalMapsNV = (PFNGLEVALMAPSNVPROC)load("glEvalMapsNV");
}